

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qbytearray.cpp
# Opt level: O0

QByteArray * __thiscall QByteArray::mid(QByteArray *this,qsizetype pos,qsizetype len)

{
  CutResult CVar1;
  qsizetype originalLength;
  QByteArray *in_RSI;
  QArrayDataPointer<char> *in_RDI;
  long in_FS_OFFSET;
  qsizetype l;
  qsizetype p;
  DataPointer *in_stack_ffffffffffffff88;
  QArrayDataPointer<char> *rawData;
  qsizetype local_18;
  qsizetype local_10;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  rawData = in_RDI;
  originalLength = size(in_RSI);
  CVar1 = QtPrivate::QContainerImplHelper::mid(originalLength,&local_10,&local_18);
  switch(CVar1) {
  case Null:
    QByteArray((QByteArray *)0x1c2138);
    break;
  case Empty:
    QArrayDataPointer<char>::fromRawData((char *)rawData,(qsizetype)in_RDI);
    QByteArray((QByteArray *)in_RDI,in_stack_ffffffffffffff88);
    QArrayDataPointer<char>::~QArrayDataPointer(in_RDI);
    break;
  case Full:
    QByteArray((QByteArray *)in_RDI,(QByteArray *)in_stack_ffffffffffffff88);
    break;
  case Subset:
    sliced(in_RSI,(qsizetype)rawData,(qsizetype)in_RDI);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  return (QByteArray *)rawData;
}

Assistant:

QByteArray QByteArray::mid(qsizetype pos, qsizetype len) const &
{
    qsizetype p = pos;
    qsizetype l = len;
    using namespace QtPrivate;
    switch (QContainerImplHelper::mid(size(), &p, &l)) {
    case QContainerImplHelper::Null:
        return QByteArray();
    case QContainerImplHelper::Empty:
    {
        return QByteArray(DataPointer::fromRawData(&_empty, 0));
    }
    case QContainerImplHelper::Full:
        return *this;
    case QContainerImplHelper::Subset:
        return sliced(p, l);
    }
    Q_UNREACHABLE_RETURN(QByteArray());
}